

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_port_packed_Test::TestBody(expr_port_packed_Test *this)

{
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  *this_00;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  __l;
  bool bVar1;
  Generator *pGVar2;
  PackedSlice *pPVar3;
  char *pcVar4;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  *local_e50;
  AssertHelper local_e30;
  Message local_e28;
  int local_e1c;
  undefined1 local_e18 [8];
  AssertionResult gtest_ar_3;
  Message local_e00;
  int local_df4;
  undefined1 local_df0 [8];
  AssertionResult gtest_ar_2;
  Message local_dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  string local_db0;
  undefined1 local_d90 [8];
  AssertionResult gtest_ar_1;
  Message local_d78;
  string local_d70;
  undefined1 local_d50 [8];
  AssertionResult gtest_ar;
  string local_d38;
  PackedSlice *local_d18;
  PackedSlice *slice2;
  string local_d08;
  undefined1 local_ce8 [8];
  PackedSlice slice1;
  allocator<char> local_a29;
  string local_a28;
  undefined1 local_a08 [8];
  PortPackedStruct port;
  bool local_765;
  int local_764;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  *local_760;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  local_758;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  local_730;
  undefined1 local_708 [40];
  undefined1 local_6e0 [8];
  shared_ptr<kratos::PackedStruct> struct_;
  allocator<char> local_6b9;
  string local_6b8;
  undefined1 local_698 [8];
  Generator mod;
  Context c;
  expr_port_packed_Test *this_local;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"mod",&local_6b9);
  pGVar2 = kratos::Context::generator((Context *)&mod.use_stmts_remove_cache_,&local_6b8);
  kratos::Generator::Generator((Generator *)local_698,pGVar2);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  local_760 = &local_758;
  local_764 = 1;
  local_765 = false;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  ::tuple<const_char_(&)[7],_int,_bool,_true,_true>
            (local_760,(char (*) [7])0x447984,&local_764,&local_765);
  local_760 = &local_730;
  port.struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 2;
  port.struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._3_1_ = 0;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
  ::tuple<const_char_(&)[7],_int,_bool,_true,_true>
            (local_760,(char (*) [7])0x4476ff,
             (int *)((long)&port.struct_.
                            super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4),
             (bool *)((long)&port.struct_.
                             super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 3));
  local_708._0_8_ = &local_758;
  local_708._8_8_ = 2;
  this_00 = (allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
             *)((long)&port.struct_.
                       super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 2);
  std::
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  ::allocator(this_00);
  __l._M_len = local_708._8_8_;
  __l._M_array = (iterator)local_708._0_8_;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
            *)(local_708 + 0x10),__l,this_00);
  std::
  make_shared<kratos::PackedStruct,char_const(&)[5],std::vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>>
            ((char (*) [5])local_6e0,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
              *)"data");
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
             *)(local_708 + 0x10));
  std::
  allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  ::~allocator((allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
                *)((long)&port.struct_.
                          super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 2));
  local_e50 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
               *)local_708;
  do {
    local_e50 = local_e50 + -1;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
    ::~tuple(local_e50);
  } while (local_e50 != &local_758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"in",&local_a29);
  std::shared_ptr<kratos::PackedStruct>::shared_ptr
            ((shared_ptr<kratos::PackedStruct> *)&slice1.original_struct_,
             (shared_ptr<kratos::PackedStruct> *)local_6e0);
  kratos::PortPackedStruct::PortPackedStruct
            ((PortPackedStruct *)local_a08,(Generator *)local_698,In,&local_a28,
             (shared_ptr<kratos::PackedStruct> *)&slice1.original_struct_);
  std::shared_ptr<kratos::PackedStruct>::~shared_ptr
            ((shared_ptr<kratos::PackedStruct> *)&slice1.original_struct_);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator(&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d08,"value2",(allocator<char> *)((long)&slice2 + 7));
  kratos::PackedSlice::PackedSlice
            ((PackedSlice *)local_ce8,(PortPackedStruct *)local_a08,&local_d08);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator((allocator<char> *)((long)&slice2 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"value2",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  pPVar3 = kratos::PortPackedStruct::operator[]((PortPackedStruct *)local_a08,&local_d38);
  std::__cxx11::string::~string((string *)&local_d38);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  local_d18 = pPVar3;
  kratos::PackedSlice::to_string_abi_cxx11_(&local_d70,(PackedSlice *)local_ce8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
            ((EqHelper *)local_d50,"slice1.to_string()","\"in.value2\"",&local_d70,
             (char (*) [10])"in.value2");
  std::__cxx11::string::~string((string *)&local_d70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d50);
  if (!bVar1) {
    testing::Message::Message(&local_d78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xa1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d50);
  kratos::PackedSlice::to_string_abi_cxx11_(&local_db0,(PackedSlice *)local_ce8);
  (*(local_d18->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x1f])(&local_dd0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d90,"slice1.to_string()","slice2.to_string()",&local_db0,&local_dd0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_db0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar1) {
    testing::Message::Message(&local_dd8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xa2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_dd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_dd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  local_df4 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_df0,"slice2.low","1",&(local_d18->super_VarSlice).low,&local_df4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_df0);
  if (!bVar1) {
    testing::Message::Message(&local_e00);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_df0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_df0);
  local_e1c = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_e18,"slice2.high","2",&(local_d18->super_VarSlice).high,&local_e1c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e18);
  if (!bVar1) {
    testing::Message::Message(&local_e28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e18);
    testing::internal::AssertHelper::AssertHelper
              (&local_e30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xa4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e30,&local_e28);
    testing::internal::AssertHelper::~AssertHelper(&local_e30);
    testing::Message::~Message(&local_e28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e18);
  kratos::PackedSlice::~PackedSlice((PackedSlice *)local_ce8);
  kratos::PortPackedStruct::~PortPackedStruct((PortPackedStruct *)local_a08);
  std::shared_ptr<kratos::PackedStruct>::~shared_ptr((shared_ptr<kratos::PackedStruct> *)local_6e0);
  kratos::Generator::~Generator((Generator *)local_698);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, port_packed) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto struct_ =
        std::make_shared<PackedStruct>("data", std::vector<std::tuple<std::string, uint32_t, bool>>{
                                                   {"value1", 1, false}, {"value2", 2, false}});
    auto port = PortPackedStruct(&mod, PortDirection::In, "in", struct_);

    auto slice1 = PackedSlice(&port, std::string{"value2"});
    auto &slice2 = port["value2"];

    EXPECT_EQ(slice1.to_string(), "in.value2");
    EXPECT_EQ(slice1.to_string(), slice2.to_string());
    EXPECT_EQ(slice2.low, 1);
    EXPECT_EQ(slice2.high, 2);
}